

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fDebugTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::AsyncCase::iterate(AsyncCase *this)

{
  BaseCase *pBVar1;
  bool bVar2;
  deBool dVar3;
  int iVar4;
  NotSupportedError *this_00;
  RenderContext *pRVar5;
  undefined4 extraout_var;
  ContextInfo *ctxInfo;
  size_type sVar7;
  const_reference pvVar8;
  pointer ppVar9;
  MessageBuilder *pMVar10;
  uchar *tbs;
  string *description;
  uchar *extraout_RDX;
  uchar *sig;
  uchar *sig_00;
  uchar *extraout_RDX_00;
  uchar *extraout_RDX_01;
  size_t tbslen;
  allocator<char> local_669;
  string local_668;
  MessageBuilder local_648;
  MessageBuilder local_4c8;
  allocator<char> local_341;
  string local_340;
  deUint32 local_31c;
  VerifyState local_318;
  int wait;
  VerifyState pass;
  int waited;
  VerifyState lastTimelyState;
  allocator<char> local_2e1;
  string local_2e0;
  ScopedLogSection local_2c0;
  ScopedLogSection section_1;
  int ndx_1;
  _Self local_2a8;
  _Self local_2a0;
  iterator itr;
  MessageBuilder local_290;
  allocator<char> local_109;
  string local_108;
  int local_e8;
  allocator<char> local_e1;
  int ndx;
  allocator<char> local_b9;
  string local_b8;
  ScopedLogSection local_98;
  ScopedLogSection section;
  GLint numMessages;
  int warnWait;
  int maxWait;
  DebugMessageTestContext context;
  TestLog *log;
  Functions *gl;
  AsyncCase *this_local;
  long lVar6;
  
  do {
    dVar3 = ::deGetFalse();
    if ((dVar3 != 0) ||
       (bVar2 = isKHRDebugSupported((this->super_BaseCase).super_ErrorCase.super_TestCase.m_context)
       , !bVar2)) {
      this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      tcu::NotSupportedError::NotSupportedError
                (this_00,"GL_KHR_debug is not supported","isKHRDebugSupported(m_context)",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fDebugTests.cpp"
                 ,0x5bc);
      __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,
                  tcu::NotSupportedError::~NotSupportedError);
    }
    dVar3 = ::deGetFalse();
  } while (dVar3 != 0);
  pRVar5 = Context::getRenderContext
                     ((this->super_BaseCase).super_ErrorCase.super_TestCase.m_context);
  iVar4 = (*pRVar5->_vptr_RenderContext[3])();
  lVar6 = CONCAT44(extraout_var,iVar4);
  context.m_debugHost =
       (BaseCase *)
       tcu::TestContext::getLog
                 ((this->super_BaseCase).super_ErrorCase.super_TestCase.super_TestCase.
                  super_TestNode.m_testCtx);
  pRVar5 = Context::getRenderContext
                     ((this->super_BaseCase).super_ErrorCase.super_TestCase.m_context);
  ctxInfo = Context::getContextInfo((this->super_BaseCase).super_ErrorCase.super_TestCase.m_context)
  ;
  DebugMessageTestContext::DebugMessageTestContext
            ((DebugMessageTestContext *)&warnWait,&this->super_BaseCase,pRVar5,ctxInfo,
             (TestLog *)context.m_debugHost,&(this->super_BaseCase).m_results,true);
  section.m_log._4_4_ = 0;
  (**(code **)(lVar6 + 0x868))(0x9145);
  (**(code **)(lVar6 + 0x7e0))(section.m_log._4_4_,0,0,0,0,0,0,0);
  (**(code **)(lVar6 + 0x5e0))(0x92e0);
  (**(code **)(lVar6 + 0x5e0))(0x8242);
  (**(code **)(lVar6 + 0x428))(0x1100,0x1100,0x1100,0,0);
  tbs = (uchar *)0x0;
  tbslen = 1;
  (**(code **)(lVar6 + 0x428))(0x8246,0x824c,0x1100);
  if ((this->m_useCallbacks & 1U) == 0) {
    (**(code **)(lVar6 + 0x420))(0);
  }
  else {
    (**(code **)(lVar6 + 0x420))(BaseCase::callbackHandle,this);
  }
  pBVar1 = context.m_debugHost;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b8,"reference run",&local_b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&ndx,"Reference run (synchronous)",&local_e1);
  tcu::ScopedLogSection::ScopedLogSection(&local_98,(TestLog *)pBVar1,&local_b8,(string *)&ndx);
  std::__cxx11::string::~string((string *)&ndx);
  std::allocator<char>::~allocator(&local_e1);
  std::__cxx11::string::~string((string *)&local_b8);
  std::allocator<char>::~allocator(&local_b9);
  for (local_e8 = 0; iVar4 = local_e8,
      sVar7 = std::
              vector<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper>_>
              ::size(&this->m_errorFuncs), iVar4 < (int)sVar7; local_e8 = local_e8 + 1) {
    pvVar8 = std::
             vector<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper>_>
             ::operator[](&this->m_errorFuncs,(long)local_e8);
    TestFunctionWrapper::call(pvVar8,(DebugMessageTestContext *)&warnWait);
  }
  tcu::ScopedLogSection::~ScopedLogSection(&local_98);
  bVar2 = std::
          map<deqp::gles31::Functional::(anonymous_namespace)::MessageID,_deqp::gles31::Functional::(anonymous_namespace)::AsyncCase::MessageCount,_std::less<deqp::gles31::Functional::(anonymous_namespace)::MessageID>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::MessageID,_deqp::gles31::Functional::(anonymous_namespace)::AsyncCase::MessageCount>_>_>
          ::empty(&this->m_counts);
  if (bVar2) {
    bVar2 = BaseCase::isDebugContext(&this->super_BaseCase);
    if (!bVar2) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_108,
                 "Need debug context to guarantee implementation behaviour (see command line options)"
                 ,&local_109);
      tcu::ResultCollector::addResult
                (&(this->super_BaseCase).m_results,QP_TEST_RESULT_QUALITY_WARNING,&local_108);
      std::__cxx11::string::~string((string *)&local_108);
      std::allocator<char>::~allocator(&local_109);
    }
    tcu::TestLog::operator<<
              (&local_290,(TestLog *)context.m_debugHost,(BeginMessageToken *)&tcu::TestLog::Message
              );
    pMVar10 = tcu::MessageBuilder::operator<<
                        (&local_290,
                         (char (*) [54])"Reference run produced no messages, nothing to verify");
    tcu::MessageBuilder::operator<<(pMVar10,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_290);
    (**(code **)(lVar6 + 0x420))(0);
    (**(code **)(lVar6 + 0x4e8))(0x92e0);
    tcu::ResultCollector::setTestContextResult
              (&(this->super_BaseCase).m_results,
               (this->super_BaseCase).super_ErrorCase.super_TestCase.super_TestCase.super_TestNode.
               m_testCtx);
  }
  else {
    local_2a0._M_node =
         (_Base_ptr)
         std::
         map<deqp::gles31::Functional::(anonymous_namespace)::MessageID,_deqp::gles31::Functional::(anonymous_namespace)::AsyncCase::MessageCount,_std::less<deqp::gles31::Functional::(anonymous_namespace)::MessageID>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::MessageID,_deqp::gles31::Functional::(anonymous_namespace)::AsyncCase::MessageCount>_>_>
         ::begin(&this->m_counts);
    while( true ) {
      local_2a8._M_node =
           (_Base_ptr)
           std::
           map<deqp::gles31::Functional::(anonymous_namespace)::MessageID,_deqp::gles31::Functional::(anonymous_namespace)::AsyncCase::MessageCount,_std::less<deqp::gles31::Functional::(anonymous_namespace)::MessageID>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::MessageID,_deqp::gles31::Functional::(anonymous_namespace)::AsyncCase::MessageCount>_>_>
           ::end(&this->m_counts);
      bVar2 = std::operator!=(&local_2a0,&local_2a8);
      if (!bVar2) break;
      ppVar9 = std::
               _Rb_tree_iterator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::MessageID,_deqp::gles31::Functional::(anonymous_namespace)::AsyncCase::MessageCount>_>
               ::operator->(&local_2a0);
      iVar4 = (ppVar9->second).received;
      ppVar9 = std::
               _Rb_tree_iterator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::MessageID,_deqp::gles31::Functional::(anonymous_namespace)::AsyncCase::MessageCount>_>
               ::operator->(&local_2a0);
      (ppVar9->second).expected = iVar4;
      ppVar9 = std::
               _Rb_tree_iterator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::MessageID,_deqp::gles31::Functional::(anonymous_namespace)::AsyncCase::MessageCount>_>
               ::operator->(&local_2a0);
      (ppVar9->second).received = 0;
      std::
      _Rb_tree_iterator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::MessageID,_deqp::gles31::Functional::(anonymous_namespace)::AsyncCase::MessageCount>_>
      ::operator++(&local_2a0,0);
    }
    (**(code **)(lVar6 + 0x4e8))(0x8242);
    for (section_1.m_log._4_4_ = 0; iVar4 = section_1.m_log._4_4_,
        sVar7 = std::
                vector<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper>_>
                ::size(&this->m_errorFuncs), pBVar1 = context.m_debugHost, iVar4 < (int)sVar7;
        section_1.m_log._4_4_ = section_1.m_log._4_4_ + 1) {
      pvVar8 = std::
               vector<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper>_>
               ::operator[](&this->m_errorFuncs,(long)section_1.m_log._4_4_);
      TestFunctionWrapper::call(pvVar8,(DebugMessageTestContext *)&warnWait);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_2e0,"result run",&local_2e1)
    ;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&lastTimelyState,"Result run (asynchronous)",
               (allocator<char> *)((long)&waited + 3));
    description = (string *)&lastTimelyState;
    tcu::ScopedLogSection::ScopedLogSection(&local_2c0,(TestLog *)pBVar1,&local_2e0,description);
    std::__cxx11::string::~string((string *)&lastTimelyState);
    std::allocator<char>::~allocator((allocator<char> *)((long)&waited + 3));
    std::__cxx11::string::~string((string *)&local_2e0);
    std::allocator<char>::~allocator(&local_2e1);
    pass = VERIFY_FAIL;
    wait = 0;
    sig = extraout_RDX;
    while( true ) {
      local_318 = verify(this,(EVP_PKEY_CTX *)0x0,sig,(size_t)description,tbs,tbslen);
      local_31c = de::max<int>(0x32,wait >> 2);
      if ((local_318 == VERIFY_PASS) || ((local_318 == VERIFY_MINIMUM && (9999 < wait)))) break;
      if (9999 < wait) {
        verify(this,(EVP_PKEY_CTX *)&DAT_00000001,sig_00,(size_t)description,tbs,tbslen);
        tcu::TestLog::operator<<
                  (&local_648,(TestLog *)context.m_debugHost,
                   (BeginMessageToken *)&tcu::TestLog::Message);
        pMVar10 = tcu::MessageBuilder::operator<<(&local_648,(char (*) [13])"Waited for ~");
        pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,&wait);
        pMVar10 = tcu::MessageBuilder::operator<<
                            (pMVar10,(char (*) [41])"ms without getting all expected messages");
        tcu::MessageBuilder::operator<<(pMVar10,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder(&local_648);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_668,
                   "Async messages were not returned to application within a reasonable timeframe",
                   &local_669);
        tcu::ResultCollector::addResult
                  (&(this->super_BaseCase).m_results,QP_TEST_RESULT_FAIL,&local_668);
        std::__cxx11::string::~string((string *)&local_668);
        std::allocator<char>::~allocator(&local_669);
        goto LAB_0060f79a;
      }
      if (wait < 100) {
        pass = local_318;
      }
      deSleep(local_31c);
      wait = local_31c + wait;
      description = (string *)(ulong)(uint)wait;
      sig = extraout_RDX_00;
      if ((this->m_useCallbacks & 1U) == 0) {
        fetchLogMessages(this);
        sig = extraout_RDX_01;
      }
    }
    verify(this,(EVP_PKEY_CTX *)&DAT_00000001,sig_00,(size_t)description,tbs,tbslen);
    if ((99 < wait) && (pass != local_318)) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_340,"Async messages were returned to application somewhat slowly",
                 &local_341);
      tcu::ResultCollector::addResult
                (&(this->super_BaseCase).m_results,QP_TEST_RESULT_QUALITY_WARNING,&local_340);
      std::__cxx11::string::~string((string *)&local_340);
      std::allocator<char>::~allocator(&local_341);
    }
    tcu::TestLog::operator<<
              (&local_4c8,(TestLog *)context.m_debugHost,(BeginMessageToken *)&tcu::TestLog::Message
              );
    pMVar10 = tcu::MessageBuilder::operator<<(&local_4c8,(char (*) [15])"Passed after ~");
    pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,&wait);
    pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,(char (*) [14])"ms of waiting");
    tcu::MessageBuilder::operator<<(pMVar10,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_4c8);
LAB_0060f79a:
    tcu::ScopedLogSection::~ScopedLogSection(&local_2c0);
    (**(code **)(lVar6 + 0x420))(0);
    (**(code **)(lVar6 + 0x4e8))(0x92e0);
    tcu::ResultCollector::setTestContextResult
              (&(this->super_BaseCase).m_results,
               (this->super_BaseCase).super_ErrorCase.super_TestCase.super_TestCase.super_TestNode.
               m_testCtx);
  }
  itr._M_node._4_4_ = 1;
  DebugMessageTestContext::~DebugMessageTestContext((DebugMessageTestContext *)&warnWait);
  return STOP;
}

Assistant:

AsyncCase::IterateResult AsyncCase::iterate (void)
{
	TCU_CHECK_AND_THROW(NotSupportedError, isKHRDebugSupported(m_context), "GL_KHR_debug is not supported");

	const glw::Functions&	gl			= m_context.getRenderContext().getFunctions();
	tcu::TestLog&			log			= m_testCtx.getLog();
	DebugMessageTestContext	context		= DebugMessageTestContext(*this, m_context.getRenderContext(), m_context.getContextInfo(), log, m_results, true);
	const int				maxWait		= 10000; // ms
	const int				warnWait	= 100;

	// Clear log from earlier messages
	{
		GLint numMessages = 0;
		gl.getIntegerv(GL_DEBUG_LOGGED_MESSAGES, &numMessages);
		gl.getDebugMessageLog(numMessages, 0, DE_NULL, DE_NULL, DE_NULL, DE_NULL, DE_NULL, DE_NULL);
	}

	gl.enable(GL_DEBUG_OUTPUT);
	gl.enable(GL_DEBUG_OUTPUT_SYNCHRONOUS);
	gl.debugMessageControl(GL_DONT_CARE, GL_DONT_CARE, GL_DONT_CARE, 0, DE_NULL, false);

	// Some messages could be dependent on the value of DEBUG_OUTPUT_SYNCHRONOUS so only use API errors which should be generated in all cases
	gl.debugMessageControl(GL_DEBUG_SOURCE_API, GL_DEBUG_TYPE_ERROR, GL_DONT_CARE, 0, DE_NULL, true);

	if (m_useCallbacks) // will use log otherwise
		gl.debugMessageCallback(callbackHandle, this);
	else
		gl.debugMessageCallback(DE_NULL, DE_NULL);

	// Reference run (synchoronous)
	{
		tcu::ScopedLogSection section(log, "reference run", "Reference run (synchronous)");

		for (int ndx = 0; ndx < int(m_errorFuncs.size()); ndx++)
			m_errorFuncs[ndx].call(context);
	}

	if (m_counts.empty())
	{
		if (!isDebugContext())
			m_results.addResult(QP_TEST_RESULT_QUALITY_WARNING, "Need debug context to guarantee implementation behaviour (see command line options)");

		log << TestLog::Message << "Reference run produced no messages, nothing to verify" << TestLog::EndMessage;

		gl.debugMessageCallback(DE_NULL, DE_NULL);
		gl.disable(GL_DEBUG_OUTPUT);

		m_results.setTestContextResult(m_testCtx);
		return STOP;
	}

	for (MessageCounter::iterator itr = m_counts.begin(); itr != m_counts.end(); itr++)
	{
		itr->second.expected = itr->second.received;
		itr->second.received = 0;
	}

	gl.disable(GL_DEBUG_OUTPUT_SYNCHRONOUS);

	// Result run (async)
	for (int ndx = 0; ndx < int(m_errorFuncs.size()); ndx++)
		m_errorFuncs[ndx].call(context);

	// Repatedly try verification, new results may be added to m_receivedMessages at any time
	{
		tcu::ScopedLogSection	section			(log, "result run", "Result run (asynchronous)");
		VerifyState				lastTimelyState = VERIFY_FAIL;

		for (int waited = 0;;)
		{
			const VerifyState	pass = verify(false);
			const int			wait = de::max(50, waited>>2);

			// Pass (possibly due to time limit)
			if (pass == VERIFY_PASS || (pass == VERIFY_MINIMUM && waited >= maxWait))
			{
				verify(true); // log

				// State changed late
				if (waited >= warnWait && lastTimelyState != pass)
					m_results.addResult(QP_TEST_RESULT_QUALITY_WARNING, "Async messages were returned to application somewhat slowly");

				log << TestLog::Message << "Passed after ~" << waited << "ms of waiting" << TestLog::EndMessage;
				break;
			}
			// fail
			else if (waited >= maxWait)
			{
				verify(true); // log

				log << TestLog::Message << "Waited for ~" << waited << "ms without getting all expected messages" << TestLog::EndMessage;
				m_results.addResult(QP_TEST_RESULT_FAIL, "Async messages were not returned to application within a reasonable timeframe");
				break;
			}

			if (waited < warnWait)
				lastTimelyState = pass;

			deSleep(wait);
			waited += wait;

			if (!m_useCallbacks)
				fetchLogMessages();
		}
	}

	gl.debugMessageCallback(DE_NULL, DE_NULL);

	gl.disable(GL_DEBUG_OUTPUT);
	m_results.setTestContextResult(m_testCtx);

	return STOP;
}